

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O3

int svb_find_avx_d1_init
              (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,uint32_t key,
              uint32_t *presult)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  uint32_t uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint32_t out [32];
  __m128i local_d8;
  ulong local_c0;
  __m128i local_b8 [8];
  
  iVar14 = 0;
  if (count < 0x20) {
LAB_0013fef8:
    uVar15 = (uint)count & 0x1f;
    if ((count & 0x1f) != 0) {
      svb_decode_scalar_d1_init
                ((uint32_t *)local_b8,keyPtr + (count >> 2 & 0xfffffffffffffff8),dataPtr,uVar15,prev
                );
      uVar8 = uVar15 - 1;
      uVar5 = (ulong)uVar8;
      if (key <= *(uint *)((long)local_b8[0] + uVar5 * 4)) {
        uVar6 = 0;
        if (2 < uVar15) {
          uVar6 = 0;
          do {
            uVar8 = (uint)uVar5;
            uVar7 = (int)(uVar8 - uVar6) / 2 + uVar6;
            uVar15 = uVar7;
            if (key <= *(uint *)((long)local_b8[0] + (long)(int)uVar7 * 4)) {
              uVar5 = (ulong)uVar7;
              uVar15 = uVar6;
              uVar8 = uVar7;
            }
            uVar6 = uVar15;
          } while ((int)(uVar6 + 1) < (int)uVar8);
        }
        if (*(uint *)((long)local_b8[0] + (long)(int)uVar6 * 4) < key) {
          uVar6 = uVar8;
        }
        count = (uint64_t)(uVar6 + iVar14);
        *presult = *(uint32_t *)((long)local_b8[0] + (long)(int)uVar6 * 4);
        goto LAB_001403b2;
      }
    }
    *presult = key + 1;
  }
  else {
    uVar12 = count >> 5;
    auVar18 = vpbroadcastd_avx512vl();
    uVar15 = 0;
    uVar5 = *(ulong *)keyPtr;
    if (uVar12 != 1) {
      uVar13 = 1;
      uVar15 = (int)uVar12 * 0x20 - 0x20;
      local_c0 = (ulong)uVar15;
      iVar14 = 0x18;
      uVar9 = uVar5;
      do {
        uVar5 = *(ulong *)(keyPtr + uVar13 * 8);
        auVar18 = vpshufd_avx(auVar18,0xff);
        if (uVar9 != 0) {
          bVar17 = (byte)(uVar9 >> 8);
          uVar10 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                          [uVar9 & 0xff];
          auVar20 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                *(undefined1 (*) [16])
                                 (shuffleTable[0] + (uint)((int)(uVar9 & 0xff) << 4)));
          auVar21 = vpslldq_avx(auVar20,4);
          auVar20 = vpaddd_avx(auVar21,auVar20);
          auVar18 = vpaddd_avx(auVar20,auVar18);
          auVar20 = vpslldq_avx(auVar20,8);
          auVar18 = vpaddd_avx(auVar18,auVar20);
          auVar21 = vpshufd_avx(auVar18,0xff);
          auVar20 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar10),
                                (undefined1  [16])shuffleTable[bVar17]);
          auVar22 = vpslldq_avx(auVar20,4);
          auVar20 = vpaddd_avx(auVar22,auVar20);
          auVar21 = vpaddd_avx(auVar20,auVar21);
          auVar20 = vpslldq_avx(auVar20,8);
          auVar20 = vpaddd_avx(auVar21,auVar20);
          if (auVar20._12_4_ < key) {
            auVar20 = vpshufd_avx(auVar20,0xff);
            uVar8 = (uint)uVar9 >> 0x10 & 0xff;
            lVar3 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                    [bVar17] + uVar10;
            uVar11 = uVar9 >> 0x18 & 0xff;
            auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])dataPtr +
                                   "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                   [bVar17] + uVar10),
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uVar8 << 4)));
            auVar21 = vpslldq_avx(auVar18,4);
            auVar18 = vpaddd_avx(auVar21,auVar18);
            auVar21 = vpslldq_avx(auVar18,8);
            auVar18 = vpaddd_avx(auVar18,auVar21);
            auVar20 = vpaddd_avx(auVar18,auVar20);
            auVar21 = vpshufd_avx(auVar20,0xff);
            auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])dataPtr +
                                   (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                          [uVar8] + lVar3),
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4))
                                 );
            auVar22 = vpslldq_avx(auVar18,4);
            auVar18 = vpaddd_avx(auVar22,auVar18);
            auVar22 = vpslldq_avx(auVar18,8);
            auVar18 = vpaddd_avx(auVar18,auVar22);
            auVar18 = vpaddd_avx(auVar18,auVar21);
            if (auVar18._12_4_ < key) {
              lVar3 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar8] + lVar3;
              auVar20 = vpshufd_avx(auVar18,0xff);
              uVar10 = uVar9 >> 0x20 & 0xff;
              lVar4 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar11] + lVar3;
              auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                     (*(undefined1 (*) [16])dataPtr +
                                     (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                            [uVar11] + lVar3),
                                    *(undefined1 (*) [16])
                                     (shuffleTable[0] + (uint)((int)uVar10 << 4)));
              uVar11 = uVar9 >> 0x28 & 0xff;
              auVar21 = vpslldq_avx(auVar18,4);
              auVar18 = vpaddd_avx(auVar21,auVar18);
              auVar21 = vpslldq_avx(auVar18,8);
              auVar18 = vpaddd_avx(auVar18,auVar21);
              auVar20 = vpaddd_avx(auVar18,auVar20);
              auVar21 = vpshufd_avx(auVar20,0xff);
              auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                     (*(undefined1 (*) [16])dataPtr +
                                     (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                            [uVar10] + lVar4),
                                    *(undefined1 (*) [16])
                                     (shuffleTable[0] + (uint)((int)uVar11 << 4)));
              auVar22 = vpslldq_avx(auVar18,4);
              auVar18 = vpaddd_avx(auVar22,auVar18);
              auVar22 = vpslldq_avx(auVar18,8);
              auVar18 = vpaddd_avx(auVar18,auVar22);
              auVar18 = vpaddd_avx(auVar18,auVar21);
              if (auVar18._12_4_ < key) {
                lVar4 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [uVar10] + lVar4;
                auVar20 = vpshufd_avx(auVar18,0xff);
                uVar10 = uVar9 >> 0x30 & 0xff;
                lVar3 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [uVar11] + lVar4;
                auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])dataPtr +
                                       (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                              [uVar11] + lVar4),
                                      *(undefined1 (*) [16])
                                       (shuffleTable[0] + (uint)((int)uVar10 << 4)));
                auVar21 = vpslldq_avx(auVar18,4);
                auVar18 = vpaddd_avx(auVar21,auVar18);
                auVar21 = vpslldq_avx(auVar18,8);
                auVar18 = vpaddd_avx(auVar18,auVar21);
                auVar20 = vpaddd_avx(auVar18,auVar20);
                auVar21 = vpshufd_avx(auVar20,0xff);
                auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                       (*(undefined1 (*) [16])dataPtr +
                                       (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                              [uVar10] + lVar3),
                                      (undefined1  [16])shuffleTable[uVar9 >> 0x38]);
                auVar22 = vpslldq_avx(auVar18,4);
                auVar18 = vpaddd_avx(auVar22,auVar18);
                auVar22 = vpslldq_avx(auVar18,8);
                auVar18 = vpaddd_avx(auVar18,auVar22);
                auVar18 = vpaddd_avx(auVar18,auVar21);
                if (auVar18._12_4_ < key) {
                  dataPtr = *(undefined1 (*) [16])dataPtr +
                            (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                   [uVar9 >> 0x38] +
                            (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                   [uVar10] + lVar3;
                  goto LAB_0013fdb0;
                }
LAB_001401dd:
                auVar27._8_4_ = 0x80000000;
                auVar27._0_8_ = 0x8000000080000000;
                auVar27._12_4_ = 0x80000000;
                auVar21 = vpbroadcastd_avx512vl();
                uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar27);
                bVar17 = (byte)uVar1 & 0xf;
                uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar27);
                bVar16 = (~bVar17 & 0xf) == 0;
                if (!bVar16) {
                  auVar18 = auVar20;
                }
                if (bVar16) {
                  bVar17 = (byte)uVar1 & 0xf;
                }
                iVar2 = 0;
                for (uVar15 = (uint)(bVar17 ^ 0xf); (uVar15 & 1) == 0;
                    uVar15 = uVar15 >> 1 | 0x80000000) {
                  iVar2 = iVar2 + 1;
                }
                auVar18 = vpshufb_avx(auVar18,*(undefined1 (*) [16])
                                               ("" + (ulong)(bVar17 ^ 0xf) * 0x10));
                uVar19 = auVar18._0_4_;
                count = (uint64_t)(iVar2 + (uint)bVar16 * 4 + iVar14);
              }
              else {
LAB_00140165:
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar21 = vpbroadcastd_avx512vl();
                uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar26);
                bVar17 = (byte)uVar1 & 0xf;
                uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar26);
                bVar16 = (~bVar17 & 0xf) == 0;
                if (bVar16) {
                  bVar17 = (byte)uVar1 & 0xf;
                  auVar20 = auVar18;
                }
                iVar2 = 0;
                for (uVar15 = (uint)(bVar17 ^ 0xf); (uVar15 & 1) == 0;
                    uVar15 = uVar15 >> 1 | 0x80000000) {
                  iVar2 = iVar2 + 1;
                }
                auVar18 = vpshufb_avx(auVar20,*(undefined1 (*) [16])
                                               ("" + (ulong)(bVar17 ^ 0xf) * 0x10));
                uVar19 = auVar18._0_4_;
                count = (uint64_t)(iVar14 + -8 + iVar2 + (uint)bVar16 * 4);
              }
            }
            else {
LAB_001400ea:
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar21 = vpbroadcastd_avx512vl();
              uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar25);
              bVar17 = (byte)uVar1 & 0xf;
              uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar25);
              bVar16 = (~bVar17 & 0xf) == 0;
              if (bVar16) {
                bVar17 = (byte)uVar1 & 0xf;
                auVar20 = auVar18;
              }
              iVar2 = 0;
              for (uVar15 = (uint)(bVar17 ^ 0xf); (uVar15 & 1) == 0;
                  uVar15 = uVar15 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              auVar18 = vpshufb_avx(auVar20,*(undefined1 (*) [16])
                                             ("" + (ulong)(bVar17 ^ 0xf) * 0x10));
              uVar19 = auVar18._0_4_;
              count = (uint64_t)(iVar14 + -0x10 + iVar2 + (uint)bVar16 * 4);
            }
          }
          else {
LAB_0014006f:
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar21 = vpbroadcastd_avx512vl();
            uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar22);
            bVar17 = (byte)uVar1 & 0xf;
            uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar22);
            bVar16 = (~bVar17 & 0xf) == 0;
            if (bVar16) {
              bVar17 = (byte)uVar1 & 0xf;
              auVar18 = auVar20;
            }
            iVar2 = 0;
            for (uVar15 = (uint)(bVar17 ^ 0xf); (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x80000000
                ) {
              iVar2 = iVar2 + 1;
            }
            auVar18 = vpshufb_avx(auVar18,*(undefined1 (*) [16])("" + (ulong)(bVar17 ^ 0xf) * 0x10))
            ;
            uVar19 = auVar18._0_4_;
            count = (uint64_t)(iVar14 + -0x18 + iVar2 + (uint)bVar16 * 4);
          }
          *presult = uVar19;
          goto LAB_001403b2;
        }
        auVar20 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
        auVar20 = vpmovzxbw_avx(auVar20);
        auVar21 = vpslldq_avx(auVar20,2);
        auVar20 = vpaddd_avx(auVar21,auVar20);
        auVar21 = vpslldq_avx(auVar20,4);
        auVar20 = vpaddd_avx(auVar20,auVar21);
        auVar21 = vpmovzxwd_avx(auVar20);
        auVar18 = vpaddd_avx(auVar18,auVar21);
        auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
        auVar20 = vpaddd_avx(auVar18,auVar20);
        if (key <= auVar20._12_4_) goto LAB_0014006f;
        auVar18 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
        auVar21 = vpshufd_avx(auVar20,0xff);
        auVar18 = vpmovzxbw_avx(auVar18);
        auVar20 = vpslldq_avx(auVar18,2);
        auVar18 = vpaddd_avx(auVar20,auVar18);
        auVar20 = vpslldq_avx(auVar18,4);
        auVar18 = vpaddd_avx(auVar18,auVar20);
        auVar20 = vpmovzxwd_avx(auVar18);
        auVar20 = vpaddd_avx(auVar21,auVar20);
        auVar18 = vpunpckhwd_avx(auVar18,(undefined1  [16])0x0);
        auVar18 = vpaddd_avx(auVar20,auVar18);
        if (key <= auVar18._12_4_) goto LAB_001400ea;
        auVar20 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
        auVar21 = vpshufd_avx(auVar18,0xff);
        auVar18 = vpmovzxbw_avx(auVar20);
        auVar20 = vpslldq_avx(auVar18,2);
        auVar18 = vpaddd_avx(auVar20,auVar18);
        auVar20 = vpslldq_avx(auVar18,4);
        auVar18 = vpaddd_avx(auVar18,auVar20);
        auVar20 = vpmovzxwd_avx(auVar18);
        auVar20 = vpaddd_avx(auVar21,auVar20);
        auVar18 = vpunpckhwd_avx(auVar18,(undefined1  [16])0x0);
        auVar18 = vpaddd_avx(auVar20,auVar18);
        if (key <= auVar18._12_4_) goto LAB_00140165;
        auVar20 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8));
        auVar21 = vpshufd_avx(auVar18,0xff);
        auVar18 = vpmovzxbw_avx(auVar20);
        auVar20 = vpslldq_avx(auVar18,2);
        auVar18 = vpaddd_avx(auVar20,auVar18);
        auVar20 = vpslldq_avx(auVar18,4);
        auVar18 = vpaddd_avx(auVar18,auVar20);
        auVar20 = vpmovzxwd_avx(auVar18);
        auVar20 = vpaddd_avx(auVar21,auVar20);
        auVar18 = vpunpckhwd_avx(auVar18,(undefined1  [16])0x0);
        auVar18 = vpaddd_avx(auVar20,auVar18);
        if (key <= auVar18._12_4_) goto LAB_001401dd;
        dataPtr = (uint8_t *)((long)dataPtr + 0x20);
LAB_0013fdb0:
        iVar14 = iVar14 + 0x20;
        uVar13 = uVar13 + 1;
        uVar9 = uVar5;
      } while (uVar12 != uVar13);
    }
    if (uVar5 == 0) {
      auVar20 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
      auVar21 = vpshufd_avx(auVar18,0xff);
      auVar18 = vpmovzxbw_avx(auVar20);
      auVar20 = vpslldq_avx(auVar18,2);
      auVar18 = vpaddd_avx(auVar20,auVar18);
      auVar20 = vpslldq_avx(auVar18,4);
      auVar18 = vpaddd_avx(auVar18,auVar20);
      auVar20 = vpmovzxwd_avx(auVar18);
      auVar20 = vpaddd_avx(auVar21,auVar20);
      auVar18 = vpunpckhwd_avx(auVar18,(undefined1  [16])0x0);
      auVar18 = vpaddd_avx(auVar20,auVar18);
      if (auVar18._12_4_ < key) {
        auVar20 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
        auVar21 = vpshufd_avx(auVar18,0xff);
        auVar18 = vpmovzxbw_avx(auVar20);
        auVar20 = vpslldq_avx(auVar18,2);
        auVar18 = vpaddd_avx(auVar20,auVar18);
        auVar20 = vpslldq_avx(auVar18,4);
        auVar18 = vpaddd_avx(auVar18,auVar20);
        auVar20 = vpmovzxwd_avx(auVar18);
        auVar20 = vpaddd_avx(auVar21,auVar20);
        auVar18 = vpunpckhwd_avx(auVar18,(undefined1  [16])0x0);
        auVar18 = vpaddd_avx(auVar20,auVar18);
        if (auVar18._12_4_ < key) {
          auVar20 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
          auVar21 = vpshufd_avx(auVar18,0xff);
          auVar18 = vpmovzxbw_avx(auVar20);
          auVar20 = vpslldq_avx(auVar18,2);
          auVar18 = vpaddd_avx(auVar20,auVar18);
          auVar20 = vpslldq_avx(auVar18,4);
          auVar18 = vpaddd_avx(auVar18,auVar20);
          auVar20 = vpmovzxwd_avx(auVar18);
          local_d8 = (__m128i)vpaddd_avx(auVar21,auVar20);
          auVar18 = vpunpckhwd_avx(auVar18,(undefined1  [16])0x0);
          local_b8[0] = (__m128i)vpaddd_avx((undefined1  [16])local_d8,auVar18);
          if (key <= local_b8[0][1]._4_4_) {
            iVar14 = find_lower_bound(local_b8,&local_d8,key,presult);
            count = (uint64_t)(uVar15 + 0x10 + iVar14);
            goto LAB_001403b2;
          }
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *(ulong *)(*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8);
          auVar18 = vpmovzxbw_avx(auVar18);
          auVar21 = vpshufd_avx((undefined1  [16])local_b8[0],0xff);
          auVar20 = vpslldq_avx(auVar18,2);
          auVar18 = vpaddd_avx(auVar20,auVar18);
          auVar20 = vpslldq_avx(auVar18,4);
          auVar18 = vpaddd_avx(auVar18,auVar20);
          auVar20 = vpmovzxwd_avx(auVar18);
          auVar18 = vpunpckhwd_avx(auVar18,(undefined1  [16])0x0);
          local_d8 = (__m128i)vpaddd_avx(auVar21,auVar20);
          local_b8[0] = (__m128i)vpaddd_avx((undefined1  [16])local_d8,auVar18);
          prev = local_b8[0][1]._4_4_;
          if (key <= prev) {
            iVar14 = find_lower_bound(local_b8,&local_d8,key,presult);
            count = (uint64_t)(uVar15 + 0x18 + iVar14);
            goto LAB_001403b2;
          }
          dataPtr = (uint8_t *)((long)dataPtr + 0x20);
LAB_0013fef4:
          iVar14 = uVar15 + 0x20;
          goto LAB_0013fef8;
        }
        auVar29._8_4_ = 0x80000000;
        auVar29._0_8_ = 0x8000000080000000;
        auVar29._12_4_ = 0x80000000;
        auVar21 = vpbroadcastd_avx512vl();
        uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar29);
        bVar17 = (byte)uVar1 & 0xf;
        uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar29);
        bVar16 = (~bVar17 & 0xf) == 0;
        if (!bVar16) {
          auVar18 = auVar20;
        }
        if (bVar16) {
          bVar17 = (byte)uVar1 & 0xf;
        }
        iVar14 = 0;
        for (uVar8 = (uint)(bVar17 ^ 0xf); (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
          iVar14 = iVar14 + 1;
        }
        auVar18 = vpshufb_avx(auVar18,*(undefined1 (*) [16])("" + (ulong)(bVar17 ^ 0xf) * 0x10));
        uVar19 = auVar18._0_4_;
        count = (uint64_t)(iVar14 + (uint)bVar16 * 4 | uVar15 | 8);
      }
      else {
        auVar24._8_4_ = 0x80000000;
        auVar24._0_8_ = 0x8000000080000000;
        auVar24._12_4_ = 0x80000000;
        auVar21 = vpbroadcastd_avx512vl();
        uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar24);
        bVar17 = (byte)uVar1 & 0xf;
        uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar24);
        bVar16 = (~bVar17 & 0xf) == 0;
        if (!bVar16) {
          auVar18 = auVar20;
        }
        if (bVar16) {
          bVar17 = (byte)uVar1 & 0xf;
        }
        iVar14 = 0;
        for (uVar8 = (uint)(bVar17 ^ 0xf); (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
          iVar14 = iVar14 + 1;
        }
        auVar18 = vpshufb_avx(auVar18,*(undefined1 (*) [16])("" + (ulong)(bVar17 ^ 0xf) * 0x10));
        uVar19 = auVar18._0_4_;
        count = (uint64_t)(iVar14 + (uint)bVar16 * 4 | uVar15);
      }
    }
    else {
      auVar20 = vpshufd_avx(auVar18,0xff);
      uVar12 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [uVar5 & 0xff];
      auVar18 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                            *(undefined1 (*) [16])
                             (shuffleTable[0] + (uint)((int)(uVar5 & 0xff) << 4)));
      bVar17 = (byte)(uVar5 >> 8);
      auVar21 = vpslldq_avx(auVar18,4);
      auVar18 = vpaddd_avx(auVar21,auVar18);
      auVar20 = vpaddd_avx(auVar18,auVar20);
      auVar18 = vpslldq_avx(auVar18,8);
      auVar18 = vpaddd_avx(auVar20,auVar18);
      auVar21 = vpshufd_avx(auVar18,0xff);
      auVar20 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar12),
                            (undefined1  [16])shuffleTable[bVar17]);
      auVar22 = vpslldq_avx(auVar20,4);
      auVar20 = vpaddd_avx(auVar22,auVar20);
      auVar21 = vpaddd_avx(auVar20,auVar21);
      auVar20 = vpslldq_avx(auVar20,8);
      auVar20 = vpaddd_avx(auVar21,auVar20);
      if (auVar20._12_4_ < key) {
        auVar20 = vpshufd_avx(auVar20,0xff);
        uVar8 = (uint)uVar5 >> 0x10 & 0xff;
        lVar3 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [bVar17] + uVar12;
        uVar9 = uVar5 >> 0x18 & 0xff;
        auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [bVar17] + uVar12),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uVar8 << 4)));
        auVar21 = vpslldq_avx(auVar18,4);
        auVar18 = vpaddd_avx(auVar21,auVar18);
        auVar21 = vpslldq_avx(auVar18,8);
        auVar18 = vpaddd_avx(auVar18,auVar21);
        auVar18 = vpaddd_avx(auVar18,auVar20);
        auVar21 = vpshufd_avx(auVar18,0xff);
        auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar8] + lVar3),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
        auVar22 = vpslldq_avx(auVar20,4);
        auVar20 = vpaddd_avx(auVar22,auVar20);
        auVar22 = vpslldq_avx(auVar20,8);
        auVar20 = vpaddd_avx(auVar20,auVar22);
        auVar20 = vpaddd_avx(auVar20,auVar21);
        if (auVar20._12_4_ < key) {
          lVar3 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar8] + lVar3;
          auVar20 = vpshufd_avx(auVar20,0xff);
          uVar12 = uVar5 >> 0x20 & 0xff;
          lVar4 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar9] + lVar3;
          auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr +
                                 (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                        [uVar9] + lVar3),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
          uVar9 = uVar5 >> 0x28 & 0xff;
          auVar21 = vpslldq_avx(auVar18,4);
          auVar18 = vpaddd_avx(auVar21,auVar18);
          auVar21 = vpslldq_avx(auVar18,8);
          auVar18 = vpaddd_avx(auVar18,auVar21);
          auVar18 = vpaddd_avx(auVar18,auVar20);
          auVar21 = vpshufd_avx(auVar18,0xff);
          auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr +
                                 (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                        [uVar12] + lVar4),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
          auVar22 = vpslldq_avx(auVar20,4);
          auVar20 = vpaddd_avx(auVar22,auVar20);
          auVar22 = vpslldq_avx(auVar20,8);
          auVar20 = vpaddd_avx(auVar20,auVar22);
          auVar20 = vpaddd_avx(auVar20,auVar21);
          if (auVar20._12_4_ < key) {
            lVar4 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar12] + lVar4;
            auVar20 = vpshufd_avx(auVar20,0xff);
            uVar12 = uVar5 >> 0x30 & 0xff;
            lVar3 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar9] + lVar4;
            auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])dataPtr +
                                   (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                          [uVar9] + lVar4),
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4))
                                 );
            auVar21 = vpslldq_avx(auVar18,4);
            auVar18 = vpaddd_avx(auVar21,auVar18);
            auVar21 = vpslldq_avx(auVar18,8);
            auVar18 = vpaddd_avx(auVar18,auVar21);
            local_d8 = (__m128i)vpaddd_avx(auVar18,auVar20);
            auVar20 = vpshufd_avx((undefined1  [16])local_d8,0xff);
            auVar18 = vpshufb_avx(*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])dataPtr +
                                   (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                          [uVar12] + lVar3),
                                  (undefined1  [16])shuffleTable[uVar5 >> 0x38]);
            auVar21 = vpslldq_avx(auVar18,4);
            auVar18 = vpaddd_avx(auVar21,auVar18);
            auVar21 = vpslldq_avx(auVar18,8);
            auVar18 = vpaddd_avx(auVar18,auVar21);
            local_b8[0] = (__m128i)vpaddd_avx(auVar18,auVar20);
            prev = local_b8[0][1]._4_4_;
            if (key <= prev) {
              iVar14 = find_lower_bound(local_b8,&local_d8,key,presult);
              count = (uint64_t)(uVar15 + 0x18 + iVar14);
              goto LAB_001403b2;
            }
            dataPtr = *(undefined1 (*) [16])dataPtr +
                      (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar12] +
                      (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar5 >> 0x38] + lVar3;
            goto LAB_0013fef4;
          }
          auVar30._8_4_ = 0x80000000;
          auVar30._0_8_ = 0x8000000080000000;
          auVar30._12_4_ = 0x80000000;
          auVar21 = vpbroadcastd_avx512vl();
          uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar30);
          bVar17 = (byte)uVar1 & 0xf;
          uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar30);
          bVar16 = (~bVar17 & 0xf) == 0;
          if (bVar16) {
            bVar17 = (byte)uVar1 & 0xf;
            auVar18 = auVar20;
          }
          iVar14 = 0;
          for (uVar8 = (uint)(bVar17 ^ 0xf); (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
            iVar14 = iVar14 + 1;
          }
          auVar18 = vpshufb_avx(auVar18,*(undefined1 (*) [16])("" + (ulong)(bVar17 ^ 0xf) * 0x10));
          uVar19 = auVar18._0_4_;
          count = (uint64_t)(iVar14 + 0x10 + uVar15 + (uint)bVar16 * 4);
        }
        else {
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar21 = vpbroadcastd_avx512vl();
          uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar28);
          bVar17 = (byte)uVar1 & 0xf;
          uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar28);
          bVar16 = (~bVar17 & 0xf) == 0;
          if (bVar16) {
            bVar17 = (byte)uVar1 & 0xf;
            auVar18 = auVar20;
          }
          iVar14 = 0;
          for (uVar8 = (uint)(bVar17 ^ 0xf); (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
            iVar14 = iVar14 + 1;
          }
          auVar18 = vpshufb_avx(auVar18,*(undefined1 (*) [16])("" + (ulong)(bVar17 ^ 0xf) * 0x10));
          uVar19 = auVar18._0_4_;
          count = (uint64_t)(iVar14 + 8 + uVar15 + (uint)bVar16 * 4);
        }
      }
      else {
        auVar23._8_4_ = 0x80000000;
        auVar23._0_8_ = 0x8000000080000000;
        auVar23._12_4_ = 0x80000000;
        auVar21 = vpbroadcastd_avx512vl();
        uVar1 = vpcmpgtd_avx512vl(auVar21,auVar18 ^ auVar23);
        bVar17 = (byte)uVar1 & 0xf;
        uVar1 = vpcmpgtd_avx512vl(auVar21,auVar20 ^ auVar23);
        bVar16 = (~bVar17 & 0xf) == 0;
        if (bVar16) {
          bVar17 = (byte)uVar1 & 0xf;
          auVar18 = auVar20;
        }
        iVar14 = 0;
        for (uVar8 = (uint)(bVar17 ^ 0xf); (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
          iVar14 = iVar14 + 1;
        }
        auVar18 = vpshufb_avx(auVar18,*(undefined1 (*) [16])("" + (ulong)(bVar17 ^ 0xf) * 0x10));
        uVar19 = auVar18._0_4_;
        count = (uint64_t)(uVar15 + (uint)bVar16 * 4 + iVar14);
      }
    }
    *presult = uVar19;
  }
LAB_001403b2:
  return (int)count;
}

Assistant:

int svb_find_avx_d1_init(uint8_t *keyPtr, uint8_t *dataPtr, uint64_t count,
                         uint32_t prev, uint32_t key, uint32_t *presult) {
  uint64_t keybytes = count / 4; // number of key bytes
  int consumedInts = 0;

  if (keybytes >= 8) {
    xmm_t PrevHi = _mm_set1_epi32(prev);
    xmm_t PrevLow;
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }
        dataPtr += 32;
        consumedInts += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 8 + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 16 + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 24 + s);
      }

      consumedInts += 32;
    }
    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }

        dataPtr += 32;
        consumedInts += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }

        consumedInts += 32;
      }
      // extract the highest integer which was stored so far;
      // it will be the "prev" value for the remaining data
      prev = (uint32_t)_mm_extract_epi32(PrevHi, 3);
    }
  }
  uint32_t keysleft = count & 31;
  if (keysleft > 0) {
    uint64_t consumedkeys = keybytes - (keybytes & 7);
    uint32_t out[32];
    svb_decode_scalar_d1_init(out, keyPtr + consumedkeys, dataPtr, keysleft,
                              prev);
    if (key <= out[keysleft - 1]) {
      int s = lower_bound(out, key, 0, keysleft);
      assert(s >= 0 && s < (int)keysleft);
      *presult = out[s];
      return (consumedInts + s);
    }
  }

  // key was not found!
  *presult = key + 1;
  return (int)count;
}